

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverTable.hpp
# Opt level: O2

void __thiscall trt_pose::parse::utils::CoverTable::CoverTable(CoverTable *this,int nrows,int ncols)

{
  this->nrows = nrows;
  this->ncols = ncols;
  (this->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->rows,(long)nrows,false);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->cols,(long)ncols,false);
  return;
}

Assistant:

CoverTable(int nrows, int ncols) : nrows(nrows), ncols(ncols)
  {
    rows.resize(nrows);
    cols.resize(ncols);
  }